

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O3

string * __thiscall
Component::NiceName_abi_cxx11_(string *__return_storage_ptr__,Component *this,char sub)

{
  char *__s;
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_t sVar4;
  size_type sVar5;
  
  iVar3 = std::__cxx11::string::compare((char *)this);
  if (iVar3 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"ROOT","");
  }
  else {
    pcVar1 = (this->root).m_pathname._M_dataplus._M_p;
    __s = pcVar1 + 2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar4 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,pcVar1 + sVar4 + 2);
    sVar2 = __return_storage_ptr__->_M_string_length;
    if (sVar2 != 0) {
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      sVar5 = 0;
      do {
        if (pcVar1[sVar5] == '/') {
          pcVar1[sVar5] = sub;
        }
        sVar5 = sVar5 + 1;
      } while (sVar2 != sVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Component::NiceName(char sub) const {
    if (root.string() == ".") {
        return std::string("ROOT");
    }

    std::string nicename = root.generic_string().c_str() + 2;
    std::replace(nicename.begin(), nicename.end(), '/', sub);
    return nicename;
}